

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

enable_if_t<_detail::move_never<stepping_variable>::value,_AbstractIsolineTracer<>::stepping_variable>
 pybind11::move<AbstractIsolineTracer<double>::stepping_variable>(object *obj)

{
  itype *piVar1;
  runtime_error *this;
  long *plVar2;
  size_type *psVar3;
  type_info *ptVar4;
  make_caster<AbstractIsolineTracer<>::stepping_variable> conv;
  handle local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  type_caster_generic local_c8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((int)((obj->super_handle).m_ptr)->ob_refcnt < 2) {
    detail::type_caster_generic::type_caster_generic
              (&local_c8,(type_info *)&AbstractIsolineTracer<double>::stepping_variable::typeinfo);
    detail::load_type<AbstractIsolineTracer<double>::stepping_variable,void>
              ((type_caster<AbstractIsolineTracer<double>::stepping_variable,_void> *)&local_c8,
               &obj->super_handle);
    piVar1 = detail::type_caster_base::operator_cast_to_stepping_variable_
                       ((type_caster_base *)&local_c8);
    return *piVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_f0.m_ptr = (PyObject *)PyObject_Str(((obj->super_handle).m_ptr)->ob_type);
  str::operator_cast_to_string(&local_88,(str *)&local_f0);
  std::operator+(&local_68,"Unable to move from Python ",&local_88);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar3) {
    local_e8.field_2._M_allocated_capacity = *psVar3;
    local_e8.field_2._8_8_ = plVar2[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar3;
  }
  local_e8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  type_id<AbstractIsolineTracer<double>::stepping_variable>();
  std::operator+(&local_48,&local_e8,&local_a8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8.typeinfo = (type_info *)*plVar2;
  ptVar4 = (type_info *)(plVar2 + 2);
  if (local_c8.typeinfo == ptVar4) {
    local_c8.value = ptVar4->type;
    lStack_b0 = plVar2[3];
    local_c8.typeinfo = (type_info *)&local_c8.value;
  }
  else {
    local_c8.value = ptVar4->type;
  }
  local_c8.cpptype = (type_info *)plVar2[1];
  *plVar2 = (long)ptVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_c8);
  *(undefined ***)this = &PTR__runtime_error_001abd80;
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}